

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

char * cstring_from_token(gravity_parser_t *parser,gtoken_s token)

{
  char *__src;
  char *__dest;
  char *str;
  char *buffer;
  gravity_parser_t *pgStack_10;
  uint32_t len;
  gravity_parser_t *parser_local;
  
  buffer._4_4_ = 0;
  pgStack_10 = parser;
  __src = token_string(token,(uint32_t *)((long)&buffer + 4));
  __dest = (char *)gravity_calloc((gravity_vm *)0x0,1,(ulong)(buffer._4_4_ + 1));
  memcpy(__dest,__src,(ulong)buffer._4_4_);
  return __dest;
}

Assistant:

static char *cstring_from_token (gravity_parser_t *parser, gtoken_s token) {
    #pragma unused(parser)
    uint32_t len = 0;
    const char *buffer = token_string(token, &len);

    char *str = (char *)mem_alloc(NULL, len+1);
    memcpy(str, buffer, len);
    return str;
}